

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O0

void __thiscall MyServerConnection::OnClose(MyServerConnection *this,SDKJsonResult *reason)

{
  TonkStatusEx status;
  LogStringBuffer buffer;
  SDKJsonResult *in_stack_fffffffffffffa18;
  LogStringBuffer *in_stack_fffffffffffffa20;
  LogStringBuffer *buffer_00;
  Channel *pCVar1;
  LogStringBuffer *this_00;
  SDKConnection *in_stack_fffffffffffffa98;
  SDKConnectionList<MyServerConnection> *in_stack_fffffffffffffaa0;
  char acStack_50e [40];
  ushort local_4e6 [27];
  string *local_4b0;
  char *local_4a8;
  ushort *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  Channel *local_480;
  string *local_478;
  char *local_470;
  ushort *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined4 local_444;
  Channel *local_440;
  undefined4 local_434;
  Channel *local_430;
  undefined1 local_418 [16];
  ostream aoStack_408 [376];
  string *local_290;
  char *local_288;
  ushort *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined4 local_25c;
  Channel *local_258;
  string *local_250;
  char *local_248;
  ushort *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined8 local_220;
  undefined1 *local_218;
  Channel *local_210;
  undefined8 local_208;
  undefined1 *local_200;
  Channel *local_1f8;
  undefined8 local_1f0;
  undefined1 *local_1e8;
  string *local_1e0;
  char *local_1d8;
  ushort *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  LogStringBuffer *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  LogStringBuffer *local_190;
  string *local_188;
  char *local_180;
  ushort *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  LogStringBuffer *local_158;
  char *local_150;
  undefined1 *local_148;
  LogStringBuffer *local_140;
  char *local_138;
  undefined1 *local_130;
  char *local_128;
  undefined1 *local_120;
  string *local_118;
  char *local_110;
  ushort *local_108;
  char *local_100;
  undefined1 *local_f8;
  LogStringBuffer *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  LogStringBuffer *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  string *local_c0;
  char *local_b8;
  ushort *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  ushort *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  ushort *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  char *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  char *local_38;
  undefined1 *local_30;
  string *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  string *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffffa20);
  tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffffa18);
  local_480 = &Logger;
  local_488 = "Client disconnected from ";
  local_498 = " : ";
  local_4a8 = " - Reason = ";
  local_4b0 = (string *)&stack0xfffffffffffffaa0;
  local_440 = &Logger;
  local_444 = 2;
  local_450 = "Client disconnected from ";
  local_460 = " : ";
  local_470 = " - Reason = ";
  local_430 = &Logger;
  local_434 = 2;
  local_4a0 = local_4e6;
  local_490 = acStack_50e;
  local_478 = local_4b0;
  local_468 = local_4e6;
  local_458 = acStack_50e;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_258 = &Logger;
    local_25c = 2;
    local_268 = "Client disconnected from ";
    local_278 = " : ";
    local_288 = " - Reason = ";
    local_290 = local_4b0;
    local_280 = local_4e6;
    local_270 = acStack_50e;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,Trace);
    local_220 = 0x1182f8;
    local_210 = &Logger;
    local_218 = local_418;
    local_228 = local_268;
    local_230 = local_270;
    local_238 = local_278;
    local_240 = local_280;
    local_248 = local_288;
    local_250 = local_290;
    pCVar1 = &Logger;
    local_1f8 = &Logger;
    local_208 = local_220;
    local_200 = local_218;
    local_1f0 = local_220;
    local_1e8 = local_218;
    std::operator<<(aoStack_408,(string *)&Logger.Prefix);
    local_1b0 = local_218;
    local_1b8 = local_228;
    local_1c0 = local_230;
    local_1c8 = local_238;
    local_1d0 = local_240;
    local_1d8 = local_248;
    local_1e0 = local_250;
    local_198 = local_218;
    local_1a0 = local_228;
    local_120 = local_218;
    local_128 = local_228;
    this_00 = (LogStringBuffer *)pCVar1;
    local_1a8 = (LogStringBuffer *)pCVar1;
    local_190 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_218 + 0x10),local_228);
    local_160 = local_1b0;
    local_168 = local_1c0;
    local_170 = local_1c8;
    local_178 = local_1d0;
    local_180 = local_1d8;
    local_188 = local_1e0;
    local_148 = local_1b0;
    local_150 = local_1c0;
    local_130 = local_1b0;
    local_138 = local_1c0;
    buffer_00 = (LogStringBuffer *)pCVar1;
    local_158 = (LogStringBuffer *)pCVar1;
    local_140 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_1b0 + 0x10),local_1c0);
    local_f8 = local_160;
    local_100 = local_170;
    local_108 = local_178;
    local_110 = local_180;
    local_118 = local_188;
    local_e0 = local_160;
    local_e8 = local_170;
    local_c8 = local_160;
    local_d0 = local_170;
    local_f0 = (LogStringBuffer *)pCVar1;
    local_d8 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_160 + 0x10),local_170);
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_90 = local_f8;
    local_98 = local_108;
    local_78 = local_f8;
    local_80 = local_108;
    local_a0 = (LogStringBuffer *)pCVar1;
    local_88 = (LogStringBuffer *)pCVar1;
    std::ostream::operator<<((ostream *)(local_f8 + 0x10),*local_108);
    local_60 = local_a8;
    local_68 = local_b8;
    local_70 = local_c0;
    local_48 = local_a8;
    local_50 = local_b8;
    local_30 = local_a8;
    local_38 = local_b8;
    local_58 = (LogStringBuffer *)pCVar1;
    local_40 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    local_18 = (LogStringBuffer *)pCVar1;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x105fab);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa0);
  tonk::SDKConnectionList<MyServerConnection>::Remove
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  return;
}

Assistant:

void MyServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    auto status = GetStatusEx();

    Logger.Info("Client disconnected from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort, " - Reason = ", reason.ToString());

    Server->ConnectionList.Remove(this);
}